

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlyphBoundaries.cpp
# Opt level: O2

void __thiscall
GlyphBoundaries::NormalizeSumAndDiff
          (GlyphBoundaries *this,int mSum,int mDiff,float *pdSum,float *pdDiff)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar2 = this->m_myBbMin;
  iVar3 = this->m_mxBbMax;
  iVar1 = iVar2 + this->m_mxBbMin;
  iVar4 = this->m_mxBbMin - this->m_myBbMax;
  *pdSum = (float)(mSum - iVar1) / (float)((iVar3 - iVar1) + this->m_myBbMax);
  *pdDiff = (float)(mDiff - iVar4) / (float)(iVar3 - (iVar2 + iVar4));
  return;
}

Assistant:

void GlyphBoundaries::NormalizeSumAndDiff(int mSum, int mDiff, float * pdSum, float * pdDiff)
{
	// Calculate the scaling factor for normalizing the diagonals.
	int mMinSum = m_mxBbMin + m_myBbMin;	// lower-left point
	int mMaxSum = m_mxBbMax + m_myBbMax;	// upper-right point
	int mMinDiff = m_mxBbMin - m_myBbMax;	// upper-left point
	int mMaxDiff = m_mxBbMax - m_myBbMin;	// lower-right point

	int mSumScale = mMaxSum - mMinSum;
	int mDiffScale = mMaxDiff - mMinDiff;
	Assert(mSumScale == mDiffScale);

	*pdSum = (float)(mSum - mMinSum) / mSumScale;
	*pdDiff = (float)(mDiff - mMinDiff) / mDiffScale;
}